

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Maybe<kj::FsNode::Metadata> * __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryLstat
          (Maybe<kj::FsNode::Metadata> *__return_storage_ptr__,InMemoryDirectory *this,PathPtr path)

{
  int iVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  stat *__buf;
  char *pcVar5;
  uint64_t uVar6;
  StringPtr name;
  StringPtr name_00;
  Fault f;
  undefined1 local_58;
  undefined7 uStack_57;
  Disposer DStack_50;
  uint64_t local_48;
  long lStack_40;
  Maybe<kj::_::Mutex::Waiter_&> local_38;
  _Base_ptr p_Stack_30;
  
  sVar4 = path.parts.size_;
  __buf = (stat *)path.parts.ptr;
  if (sVar4 != 1) {
    if (sVar4 == 0) {
      stat((InMemoryDirectory *)&(__return_storage_ptr__->ptr).field_1.value,(char *)this,__buf);
      (__return_storage_ptr__->ptr).isSet = true;
      return __return_storage_ptr__;
    }
    if (__buf->st_ino == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)__buf->st_dev;
    }
    name_00.content.size_ = (size_t)pcVar5;
    name_00.content.ptr = (char *)this;
    tryGetParent((InMemoryDirectory *)&stack0xffffffffffffffa8,name_00);
    if ((InMemoryFileFactory *)DStack_50._vptr_Disposer != (InMemoryFileFactory *)0x0) {
      (**(code **)(*DStack_50._vptr_Disposer + 0x48))
                (__return_storage_ptr__,DStack_50._vptr_Disposer,&__buf->st_mode,sVar4 - 1);
      (*(code *)**(undefined8 **)CONCAT71(uStack_57,local_58))
                ((undefined8 *)CONCAT71(uStack_57,local_58),
                 (InMemoryFileFactory *)
                 ((long)DStack_50._vptr_Disposer + *(long *)(*DStack_50._vptr_Disposer + -0x10)));
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->ptr).isSet = false;
    return __return_storage_ptr__;
  }
  local_58 = 0;
  kj::_::Mutex::lock(&(this->impl).mutex,1);
  if (__buf->st_ino == 0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = (char *)__buf->st_dev;
  }
  name.content.size_ = (size_t)pcVar5;
  name.content.ptr = (char *)&(this->impl).value;
  Impl::tryGetEntry((Impl *)&stack0xffffffffffffffa8,name);
  lVar3 = CONCAT71(uStack_57,local_58);
  if (lVar3 == 0) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    iVar1 = *(int *)(lVar3 + 0x18);
    if (iVar1 == 3) {
      lVar2 = *(long *)(lVar3 + 0x20);
      uVar6 = *(uint64_t *)(lVar3 + 0x30);
      if (uVar6 != 0) {
        uVar6 = *(uint64_t *)(lVar3 + 0x28);
      }
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.type = SYMLINK;
      (__return_storage_ptr__->ptr).field_1.value.size = 0;
      (__return_storage_ptr__->ptr).field_1.value.spaceUsed = 0;
      (__return_storage_ptr__->ptr).field_1.value.lastModified.value.value = lVar2;
      (__return_storage_ptr__->ptr).field_1.value.linkCount = 1;
      (__return_storage_ptr__->ptr).field_1.value.hashCode = uVar6;
    }
    else {
      if (iVar1 == 2) {
        (**(code **)(**(long **)(lVar3 + 0x28) + 0x10))(&stack0xffffffffffffffa8);
      }
      else {
        if (iVar1 != 1) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18]>
                    ((Fault *)&stack0xffffffffffffffa8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x429,FAILED,(char *)0x0,"\"unknown node type\"",
                     (char (*) [18])"unknown node type");
          (__return_storage_ptr__->ptr).isSet = false;
          kj::_::Debug::Fault::~Fault((Fault *)&stack0xffffffffffffffa8);
          goto LAB_004c48f2;
        }
        (**(code **)(**(long **)(lVar3 + 0x28) + 0x10))(&stack0xffffffffffffffa8);
      }
      (__return_storage_ptr__->ptr).isSet = true;
      *(ulong *)&(__return_storage_ptr__->ptr).field_1 = CONCAT71(uStack_57,local_58);
      (__return_storage_ptr__->ptr).field_1.value.size = (uint64_t)DStack_50._vptr_Disposer;
      (__return_storage_ptr__->ptr).field_1.value.spaceUsed = local_48;
      (__return_storage_ptr__->ptr).field_1.value.lastModified.value.value = lStack_40;
      *(Waiter **)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = local_38.ptr;
      (__return_storage_ptr__->ptr).field_1.value.hashCode = (uint64_t)p_Stack_30;
    }
  }
LAB_004c48f2:
  kj::_::Mutex::unlock(&(this->impl).mutex,SHARED,(Waiter *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Maybe<FsNode::Metadata> tryLstat(PathPtr path) const override {
    if (path.size() == 0) {
      return stat();
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_SOME(entry, lock->tryGetEntry(path[0])) {
        if (entry.node.is<FileNode>()) {
          return entry.node.get<FileNode>().file->stat();
        } else if (entry.node.is<DirectoryNode>()) {
          return entry.node.get<DirectoryNode>().directory->stat();
        } else if (entry.node.is<SymlinkNode>()) {
          auto& link = entry.node.get<SymlinkNode>();
          uint64_t hash = reinterpret_cast<uintptr_t>(link.content.begin());
          return FsNode::Metadata { FsNode::Type::SYMLINK, 0, 0, link.lastModified, 1, hash };
        } else {
          KJ_FAIL_ASSERT("unknown node type") { return kj::none; }
        }
      } else {
        return kj::none;
      }
    }